

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union.c
# Opt level: O0

LY_ERR lyplg_type_store_union
                 (ly_ctx *ctx,lysc_type *type,void *value,size_t value_len,uint32_t options,
                 LY_VALUE_FORMAT format,void *prefix_data,uint32_t hints,lysc_node *ctx_node,
                 lyd_value *storage,lys_glob_unres *unres,ly_err_item **err)

{
  LY_ERR LVar1;
  lyd_value_union *subvalue_00;
  lyd_value_union *subvalue;
  lysc_type_union *type_u;
  LY_ERR r;
  LY_ERR ret;
  LY_VALUE_FORMAT format_local;
  uint32_t options_local;
  size_t value_len_local;
  void *value_local;
  lysc_type *type_local;
  ly_ctx *ctx_local;
  
  *err = (ly_err_item *)0x0;
  ret = options;
  _format_local = value_len;
  value_len_local = (size_t)value;
  value_local = type;
  type_local = (lysc_type *)ctx;
  memset(storage,0,0x28);
  subvalue_00 = (lyd_value_union *)calloc(1,0x50);
  (storage->field_2).subvalue = subvalue_00;
  if (subvalue_00 == (lyd_value_union *)0x0) {
    type_u._4_4_ = LY_EMEM;
  }
  else {
    storage->realtype = (lysc_type *)value_local;
    subvalue_00->hints = hints;
    subvalue_00->ctx_node = ctx_node;
    if (format == LY_VALUE_LYB) {
      type_u._4_4_ = lyb_fill_subvalue((ly_ctx *)type_local,(lysc_type_union *)type,
                                       (void *)value_len_local,_format_local,prefix_data,subvalue_00
                                       ,&ret,unres,err);
    }
    else {
      ret = ret & ~LY_EDENIED;
      type_u._4_4_ = union_subvalue_assignment
                               ((void *)value_len_local,_format_local,&subvalue_00->original,
                                &subvalue_00->orig_len,&ret);
      if ((type_u._4_4_ != LY_SUCCESS) ||
         (type_u._4_4_ = lyplg_type_prefix_data_new
                                   ((ly_ctx *)type_local,(void *)value_len_local,_format_local,
                                    format,prefix_data,&subvalue_00->format,
                                    &subvalue_00->prefix_data), type_u._4_4_ != LY_SUCCESS))
      goto LAB_00236f21;
      type_u._4_4_ = union_find_type((ly_ctx *)type_local,(lysc_type_union *)type,subvalue_00,ret,
                                     '\0',(lyd_node *)0x0,(lyd_node *)0x0,(uint32_t *)0x0,unres,err)
      ;
    }
    if (((type_u._4_4_ == LY_SUCCESS) || (type_u._4_4_ == LY_EINCOMPLETE)) &&
       (LVar1 = lydict_insert((ly_ctx *)type_local,(subvalue_00->value)._canonical,0,
                              &storage->_canonical), LVar1 != LY_SUCCESS)) {
      type_u._4_4_ = LVar1;
    }
  }
LAB_00236f21:
  if ((ret & LY_EMEM) != LY_SUCCESS) {
    free((void *)value_len_local);
  }
  if ((type_u._4_4_ != LY_SUCCESS) && (type_u._4_4_ != LY_EINCOMPLETE)) {
    lyplg_type_free_union((ly_ctx *)type_local,storage);
  }
  return type_u._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_type_store_union(const struct ly_ctx *ctx, const struct lysc_type *type, const void *value, size_t value_len,
        uint32_t options, LY_VALUE_FORMAT format, void *prefix_data, uint32_t hints, const struct lysc_node *ctx_node,
        struct lyd_value *storage, struct lys_glob_unres *unres, struct ly_err_item **err)
{
    LY_ERR ret = LY_SUCCESS, r;
    struct lysc_type_union *type_u = (struct lysc_type_union *)type;
    struct lyd_value_union *subvalue;

    *err = NULL;

    /* init storage */
    memset(storage, 0, sizeof *storage);
    LYPLG_TYPE_VAL_INLINE_PREPARE(storage, subvalue);
    LY_CHECK_ERR_GOTO(!subvalue, ret = LY_EMEM, cleanup);
    storage->realtype = type;
    subvalue->hints = hints;
    subvalue->ctx_node = ctx_node;

    if (format == LY_VALUE_LYB) {
        ret = lyb_fill_subvalue(ctx, type_u, value, value_len, prefix_data, subvalue, &options, unres, err);
        LY_CHECK_GOTO((ret != LY_SUCCESS) && (ret != LY_EINCOMPLETE), cleanup);
    } else {
        /* to correctly resolve the union type, we need to always validate the value */
        options &= ~LYPLG_TYPE_STORE_ONLY;

        /* store value to subvalue */
        ret = union_subvalue_assignment(value, value_len, &subvalue->original, &subvalue->orig_len, &options);
        LY_CHECK_GOTO(ret, cleanup);

        /* store format-specific data for later prefix resolution */
        ret = lyplg_type_prefix_data_new(ctx, value, value_len, format, prefix_data, &subvalue->format,
                &subvalue->prefix_data);
        LY_CHECK_GOTO(ret, cleanup);

        /* use the first usable subtype to store the value */
        ret = union_find_type(ctx, type_u, subvalue, options, 0, NULL, NULL, NULL, unres, err);
        LY_CHECK_GOTO((ret != LY_SUCCESS) && (ret != LY_EINCOMPLETE), cleanup);
    }

    /* store canonical value, if any (use the specific type value) */
    r = lydict_insert(ctx, subvalue->value._canonical, 0, &storage->_canonical);
    LY_CHECK_ERR_GOTO(r, ret = r, cleanup);

cleanup:
    if (options & LYPLG_TYPE_STORE_DYNAMIC) {
        free((void *)value);
    }

    if ((ret != LY_SUCCESS) && (ret != LY_EINCOMPLETE)) {
        lyplg_type_free_union(ctx, storage);
    }
    return ret;
}